

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

code_point
tcb::unicode::detail::utf_traits<char16_t,2>::
decode<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
          (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *current,
          __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          last)

{
  bool bVar1;
  reference pcVar2;
  bool local_41;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_40;
  char16_t local_32;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  _Stack_30;
  uint16_t w2;
  char16_t local_22;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *p_Stack_20;
  uint16_t w1;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *current_local;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  last_local;
  
  p_Stack_20 = current;
  current_local =
       (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
        *)last._M_current;
  bVar1 = __gnu_cxx::operator==
                    (current,(__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                              *)&current_local);
  if (bVar1) {
    last_local._M_current._4_4_ = L'\xfffffffe';
  }
  else {
    _Stack_30 = __gnu_cxx::
                __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                ::operator++(p_Stack_20,0);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&stack0xffffffffffffffd0);
    local_22 = *pcVar2;
    local_41 = (ushort)local_22 < 0xd800 || 0xdfff < (ushort)local_22;
    if (local_41) {
      last_local._M_current._4_4_ = (code_point)(ushort)local_22;
    }
    else if ((ushort)local_22 < 0xdc00) {
      bVar1 = __gnu_cxx::operator==
                        (p_Stack_20,
                         (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                          *)&current_local);
      if (bVar1) {
        last_local._M_current._4_4_ = L'\xfffffffe';
      }
      else {
        local_40 = __gnu_cxx::
                   __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                   ::operator++(p_Stack_20,0);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                 ::operator*(&local_40);
        local_32 = *pcVar2;
        if (((ushort)local_32 < 0xdc00) || (0xdfff < (ushort)local_32)) {
          last_local._M_current._4_4_ = L'\xffffffff';
        }
        else {
          last_local._M_current._4_4_ =
               utf_traits<char16_t,_2>::combine_surrogate(local_22,local_32);
        }
      }
    }
    else {
      last_local._M_current._4_4_ = L'\xffffffff';
    }
  }
  return last_local._M_current._4_4_;
}

Assistant:

static TCB_CONSTEXPR14 code_point decode(It& current, S last)
    {
        if (TCB_UNLIKELY(current == last))
            return incomplete;
        uint16_t w1 = *current++;
        if (TCB_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
            return w1;
        }
        if (w1 > 0xDBFF)
            return illegal;
        if (current == last)
            return incomplete;
        uint16_t w2 = *current++;
        if (w2 < 0xDC00 || 0xDFFF < w2)
            return illegal;
        return combine_surrogate(w1, w2);
    }